

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.h
# Opt level: O0

void __thiscall xLearn::Model::Model(Model *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

Model() { }